

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reply_deferrable.c
# Opt level: O0

int contextConv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  mpt_reply_context_defer *ctx;
  void *ptr_local;
  mpt_type_t type_local;
  mpt_convertable *val_local;
  
  if (type == 0) {
    if (ptr == (void *)0x0) {
      val_local._4_4_ = 0x82;
    }
    else {
      *(uint8_t **)ptr = contextConv::fmt;
      val_local._4_4_ = 0;
    }
  }
  else if (type == 0x82) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val + 1;
    }
    val_local._4_4_ = 8;
  }
  else if (type == 8) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val + 1;
    }
    val_local._4_4_ = 0x82;
  }
  else {
    val_local._4_4_ = -3;
  }
  return val_local._4_4_;
}

Assistant:

static int contextConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	MPT_STRUCT(reply_context_defer) *ctx = MPT_baseaddr(reply_context_defer, val, _mt);
	
	if (!type) {
		static const uint8_t fmt[] = { MPT_ENUM(TypeReplyPtr), MPT_ENUM(TypeReplyDataPtr), 0 };
		if (ptr) {
			*((const uint8_t **) ptr) = fmt;
			return 0;
		}
		return MPT_ENUM(TypeReplyPtr);
	}
	if (type == MPT_ENUM(TypeReplyPtr)) {
		if (ptr) *((void **) ptr) = &ctx->_ctx;
		return MPT_ENUM(TypeReplyDataPtr);
	}
	if (type == MPT_ENUM(TypeReplyDataPtr)) {
		if (ptr) *((void **) ptr) = &ctx->_ctx;
		return MPT_ENUM(TypeReplyPtr);
	}
	return MPT_ERROR(BadType);
}